

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O3

void Cnf_CollectVolume_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  if (pObj->TravId != p->nTravIds) {
    pObj->TravId = p->nTravIds;
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                    ,99,"void Cnf_CollectVolume_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Cnf_CollectVolume_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
    Cnf_CollectVolume_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
    uVar1 = vNodes->nSize;
    if (uVar1 == vNodes->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vNodes->pArray;
    }
    iVar2 = vNodes->nSize;
    vNodes->nSize = iVar2 + 1;
    ppvVar3[iVar2] = pObj;
  }
  return;
}

Assistant:

void Cnf_CollectVolume_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    assert( Aig_ObjIsNode(pObj) );
    Cnf_CollectVolume_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Cnf_CollectVolume_rec( p, Aig_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}